

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshortcut.cpp
# Opt level: O2

void __thiscall QShortcut::setContext(QShortcut *this,ShortcutContext context)

{
  QShortcutPrivate *this_00;
  long in_FS_OFFSET;
  char local_28 [24];
  char *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QShortcutPrivate **)&this->field_0x8;
  if (this_00->sc_context != context) {
    if (QCoreApplication::self != 0) {
      this_00->sc_context = context;
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QShortcutPrivate::redoGrab(this_00,&QGuiApplicationPrivate::self->shortcutMap);
        return;
      }
      goto LAB_0050b19d;
    }
    local_28[0] = '\x02';
    local_28[1] = '\0';
    local_28[2] = '\0';
    local_28[3] = '\0';
    local_28[0x14] = '\0';
    local_28[0x15] = '\0';
    local_28[0x16] = '\0';
    local_28[0x17] = '\0';
    local_28[4] = '\0';
    local_28[5] = '\0';
    local_28[6] = '\0';
    local_28[7] = '\0';
    local_28[8] = '\0';
    local_28[9] = '\0';
    local_28[10] = '\0';
    local_28[0xb] = '\0';
    local_28[0xc] = '\0';
    local_28[0xd] = '\0';
    local_28[0xe] = '\0';
    local_28[0xf] = '\0';
    local_28[0x10] = '\0';
    local_28[0x11] = '\0';
    local_28[0x12] = '\0';
    local_28[0x13] = '\0';
    local_10 = "default";
    QMessageLogger::warning
              (local_28,"QShortcut: Initialize QGuiApplication before calling \'setContext\'.");
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_0050b19d:
  __stack_chk_fail();
}

Assistant:

void QShortcut::setContext(Qt::ShortcutContext context)
{
    Q_D(QShortcut);
    if (d->sc_context == context)
        return;
    QAPP_CHECK("setContext");
    d->sc_context = context;
    d->redoGrab(QGuiApplicationPrivate::instance()->shortcutMap);
}